

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_rational.hpp
# Opt level: O0

bool __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
::readLPF(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          *this,istream *p_input,NameSet *p_rnames,NameSet *p_cnames,DIdxSet *p_intvars)

{
  byte bVar1;
  bool bVar2;
  type_conflict5 tVar3;
  uint uVar4;
  Verbosity VVar5;
  long *plVar6;
  size_t sVar7;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *pnVar8;
  double *pdVar9;
  undefined8 uVar10;
  ostream *poVar11;
  void *this_00;
  long in_RCX;
  long lVar12;
  int __c;
  int iVar13;
  long in_RDX;
  long *in_RSI;
  long *in_RDI;
  long in_R8;
  longdouble lVar14;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  int n;
  char name [16];
  Rational pre_sign_1;
  Rational pre_sign;
  int j;
  SPxMemoryException *x;
  char *pos_old;
  char *pos;
  char *s;
  char *line;
  char *tmp;
  char *buf;
  int buf_pos;
  int buf_size;
  int k;
  int i;
  bool have_value;
  bool other;
  bool finished;
  bool unnamed;
  int lineno;
  int sense;
  int colidx;
  Rational val;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  vec;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  row;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  emptycol;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  rset;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  cset;
  NameSet *cnames;
  NameSet *rnames;
  anon_enum_32 section;
  SPxOut *in_stack_00001240;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_00001248;
  NameSet *in_stack_00001250;
  NameSet *in_stack_00001258;
  char **in_stack_00001260;
  int in_stack_0000130c;
  SPxOut *in_stack_00001310;
  char **in_stack_00001318;
  undefined4 in_stack_fffffffffffff228;
  int in_stack_fffffffffffff22c;
  undefined2 in_stack_fffffffffffff230;
  undefined2 uVar15;
  undefined2 in_stack_fffffffffffff232;
  int in_stack_fffffffffffff234;
  undefined4 in_stack_fffffffffffff238;
  int in_stack_fffffffffffff23c;
  NameSet *in_stack_fffffffffffff240;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffff248;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffff250;
  Real in_stack_fffffffffffff258;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffff260;
  undefined8 in_stack_fffffffffffff268;
  NameSet *in_stack_fffffffffffff270;
  allocator *paVar16;
  type *in_stack_fffffffffffff278;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffff280;
  undefined7 in_stack_fffffffffffff288;
  undefined1 in_stack_fffffffffffff28f;
  SPxOut *in_stack_fffffffffffff2c0;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffff2e0;
  undefined2 in_stack_fffffffffffff2e8;
  int in_stack_fffffffffffff2f8;
  undefined4 in_stack_fffffffffffff2fc;
  char local_b9d;
  undefined4 local_b1c;
  Verbosity local_b18;
  undefined1 local_b12;
  allocator local_b11;
  string local_b10 [32];
  undefined4 local_af0;
  undefined4 local_aec;
  undefined4 local_ae8;
  undefined4 local_ae4;
  undefined4 local_ae0;
  Verbosity local_adc;
  undefined1 local_ad8 [64];
  double local_a98;
  undefined4 local_a90;
  Verbosity local_a8c;
  undefined1 local_a88 [68];
  undefined4 local_a44;
  undefined4 local_a40;
  Verbosity local_a3c [2];
  uint local_a34;
  undefined4 local_a30;
  undefined4 local_a2c;
  char local_a28 [16];
  undefined1 local_a18 [72];
  double local_9d0;
  undefined1 local_9c8 [64];
  undefined1 local_988 [72];
  undefined4 local_940;
  undefined4 local_93c;
  undefined1 local_938 [140];
  undefined4 local_8ac;
  undefined1 local_8a8 [76];
  int local_85c;
  undefined1 local_858 [72];
  undefined4 local_810;
  undefined4 local_80c;
  undefined1 local_808 [140];
  undefined4 local_77c;
  undefined1 local_778 [64];
  undefined4 local_738;
  undefined4 local_734;
  undefined4 local_730;
  uint local_72c;
  char *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  int local_6ec;
  uint local_6e8;
  int local_6e4;
  int local_6e0;
  byte local_6dc;
  byte local_6db;
  byte local_6da;
  byte local_6d9;
  int local_6d8;
  int local_6d4;
  int local_6d0;
  undefined4 local_6cc;
  undefined1 local_6c8 [72];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  local_680 [31];
  undefined1 local_490 [200];
  undefined1 local_3c8 [200];
  long local_300;
  long local_2f8;
  int local_2ec;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long *local_2d0;
  byte local_2b9;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_250;
  undefined1 *local_248;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_240;
  undefined1 *local_238;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_230;
  undefined1 *local_228;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_220;
  undefined1 *local_218;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_210;
  undefined1 *local_208;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_200;
  undefined1 *local_1f8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_1f0;
  undefined1 *local_1e8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_1e0;
  undefined1 *local_1d8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_1a8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_1a0;
  undefined4 *local_198;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_190;
  undefined4 *local_188;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_180;
  undefined4 *local_178;
  undefined1 *local_170;
  undefined4 *local_168;
  undefined1 *local_160;
  undefined4 *local_158;
  undefined1 *local_150;
  undefined4 *local_148;
  undefined1 *local_140;
  undefined8 local_128;
  double *local_120;
  undefined1 *local_118;
  undefined8 local_100;
  double *local_f8;
  undefined1 *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined4 *local_d8;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 *local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 *local_98;
  undefined1 *local_90;
  undefined4 *local_88;
  undefined4 *local_80;
  undefined4 *local_78;
  undefined4 *local_70;
  undefined4 *local_68;
  undefined4 *local_60;
  undefined4 *local_58;
  undefined4 *local_50;
  undefined4 *local_48;
  double *local_40;
  double *local_38;
  double *local_30;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_28;
  double *local_20;
  double *local_18;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_10;
  double *local_8;
  
  local_2ec = 0;
  local_2e8 = in_R8;
  local_2e0 = in_RCX;
  local_2d8 = in_RDX;
  local_2d0 = in_RSI;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPColSetBase((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
                 SUB84(in_stack_fffffffffffff258,0));
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPRowSetBase(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
                 SUB84(in_stack_fffffffffffff258,0));
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPColBase((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *)in_stack_fffffffffffff280,(int)((ulong)in_stack_fffffffffffff278 >> 0x20));
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPRowBase(in_stack_fffffffffffff280,(int)((ulong)in_stack_fffffffffffff278 >> 0x20));
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff240,in_stack_fffffffffffff23c);
  local_6cc = 1;
  local_d0 = local_6c8;
  local_d8 = &local_6cc;
  local_e0 = 0;
  local_e8 = 1;
  local_78 = local_d8;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              *)CONCAT17(in_stack_fffffffffffff28f,in_stack_fffffffffffff288),
             (longlong *)in_stack_fffffffffffff280,in_stack_fffffffffffff278);
  local_6d4 = 0;
  local_6d8 = 0;
  local_6d9 = 1;
  local_6da = 0;
  local_6dc = 1;
  local_6f8 = (char *)0x0;
  local_700 = (char *)0x0;
  local_708 = (char *)0x0;
  local_710 = (char *)0x0;
  local_718 = (char *)0x0;
  local_720 = (char *)0x0;
  if (local_2e0 == 0) {
    local_300 = 0;
    spx_alloc<soplex::NameSet*>
              ((NameSet **)in_stack_fffffffffffff270,(int)((ulong)in_stack_fffffffffffff268 >> 0x20)
              );
    lVar12 = local_300;
    NameSet::NameSet(in_stack_fffffffffffff270,(int)((ulong)in_stack_fffffffffffff268 >> 0x20),
                     (int)in_stack_fffffffffffff268,(Real)in_stack_fffffffffffff260,
                     in_stack_fffffffffffff258);
    local_300 = lVar12;
  }
  else {
    local_300 = local_2e0;
  }
  NameSet::clear((NameSet *)
                 CONCAT44(in_stack_fffffffffffff234,
                          CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)));
  if (local_2d8 == 0) {
    local_2f8 = 0;
    spx_alloc<soplex::NameSet*>
              ((NameSet **)in_stack_fffffffffffff270,(int)((ulong)in_stack_fffffffffffff268 >> 0x20)
              );
    lVar12 = local_2f8;
    NameSet::NameSet(in_stack_fffffffffffff270,(int)((ulong)in_stack_fffffffffffff268 >> 0x20),
                     (int)in_stack_fffffffffffff268,(Real)in_stack_fffffffffffff260,
                     in_stack_fffffffffffff258);
    local_2f8 = lVar12;
  }
  else {
    local_2f8 = local_2d8;
  }
  iVar13 = (int)((ulong)in_stack_fffffffffffff268 >> 0x20);
  NameSet::clear((NameSet *)
                 CONCAT44(in_stack_fffffffffffff234,
                          CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)));
  clear((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
         *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
  local_6e8 = 0x2000;
  spx_alloc<char*>((char **)in_stack_fffffffffffff270,iVar13);
  spx_alloc<char*>((char **)in_stack_fffffffffffff270,iVar13);
  spx_alloc<char*>((char **)in_stack_fffffffffffff270,iVar13);
  do {
    local_6ec = 0;
    while( true ) {
      plVar6 = (long *)std::istream::getline((char *)local_2d0,(long)(local_6f8 + local_6ec));
      bVar1 = std::ios::operator!((void *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
      if ((bVar1 & 1) == 0) break;
      std::ios::clear((int)local_2d0 + (int)*(undefined8 *)(*local_2d0 + -0x18));
      sVar7 = strlen(local_6f8);
      if (sVar7 != (long)(int)local_6e8 - 1U) {
        poVar11 = std::operator<<((ostream *)&std::cerr,"ELPFRD07 No \'End\' marker found");
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        local_6da = 1;
        break;
      }
      local_6ec = local_6e8 - 1;
      local_6e8 = local_6e8 + 0x2000;
      if (0x7ffffffe < (int)local_6e8) {
        poVar11 = std::operator<<((ostream *)&std::cerr,"ELPFRD16 Line longer than INT_MAX");
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        goto LAB_001ddb02;
      }
      spx_realloc<char*>((char **)in_stack_fffffffffffff280,
                         (int)((ulong)in_stack_fffffffffffff278 >> 0x20));
    }
    if ((local_6da & 1) != 0) {
LAB_001ddac6:
      (**(code **)(*in_RDI + 0x68))(in_RDI,local_3c8,0);
      (**(code **)(*in_RDI + 0x40))(in_RDI,local_490,0);
LAB_001ddb02:
      if ((local_6da & 1) == 0) {
        poVar11 = std::operator<<((ostream *)&std::cerr,"ELPFRD15 Syntax error in line ");
        this_00 = (void *)std::ostream::operator<<(poVar11,local_6d8);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      }
      else if ((in_RDI[0x3e] != 0) &&
              (VVar5 = SPxOut::getVerbosity((SPxOut *)in_RDI[0x3e]), 3 < (int)VVar5)) {
        local_b18 = SPxOut::getVerbosity((SPxOut *)in_RDI[0x3e]);
        local_b1c = 4;
        (**(code **)(*(long *)in_RDI[0x3e] + 0x10))((long *)in_RDI[0x3e],&local_b1c);
        soplex::operator<<((SPxOut *)
                           CONCAT44(in_stack_fffffffffffff234,
                                    CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)),
                           (char *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
        soplex::operator<<((SPxOut *)
                           CONCAT44(in_stack_fffffffffffff234,
                                    CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)),
                           in_stack_fffffffffffff22c);
        soplex::operator<<((SPxOut *)
                           CONCAT44(in_stack_fffffffffffff234,
                                    CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)),
                           (char *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
        soplex::operator<<((SPxOut *)
                           CONCAT44(in_stack_fffffffffffff234,
                                    CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)),
                           (_func_ostream_ptr_ostream_ptr *)
                           CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
        (**(code **)(*(long *)in_RDI[0x3e] + 0x10))((long *)in_RDI[0x3e],&local_b18);
      }
      if (local_2e0 == 0) {
        spx_free<soplex::NameSet*>((NameSet **)0x1ddc7f);
      }
      if (local_2d8 == 0) {
        spx_free<soplex::NameSet*>((NameSet **)0x1ddc9b);
      }
      spx_free<char*>((char **)0x1ddcac);
      spx_free<char*>((char **)0x1ddcbb);
      spx_free<char*>((char **)0x1ddcca);
      local_2b9 = local_6da & 1;
      local_85c = 1;
LAB_001ddce7:
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)0x1ddcf4);
      DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::~DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)CONCAT44(in_stack_fffffffffffff234,
                                  CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)));
      LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::~LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)CONCAT44(in_stack_fffffffffffff234,
                               CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)));
      LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::~LPColBase((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)CONCAT44(in_stack_fffffffffffff234,
                               CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)));
      LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::~LPRowSetBase((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)CONCAT44(in_stack_fffffffffffff234,
                                  CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)));
      LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::~LPColSetBase((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)CONCAT44(in_stack_fffffffffffff234,
                                  CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)));
      return (bool)(local_2b9 & 1);
    }
    if (8 < local_6e8) {
      spx_realloc<char*>((char **)in_stack_fffffffffffff280,
                         (int)((ulong)in_stack_fffffffffffff278 >> 0x20));
      spx_realloc<char*>((char **)in_stack_fffffffffffff280,
                         (int)((ulong)in_stack_fffffffffffff278 >> 0x20));
    }
    local_6d8 = local_6d8 + 1;
    local_6e0 = 0;
    local_718 = local_6f8;
    SPxOut::debug<soplex::SPxOut,_const_char_(&)[35],_int_&,_char_*&,_0>
              ((SPxOut *)in_RDI[0x3e],(char (*) [35])"DLPFRD08 Reading line {} (pos={})\n",
               &local_6d8,&local_718);
    local_710 = strchr(local_6f8,0x5c);
    if (local_710 != (char *)0x0) {
      *local_710 = '\0';
    }
    if (local_2ec == 0) {
      bVar2 = LPFhasKeyword((char **)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
                            (char *)CONCAT44(in_stack_fffffffffffff234,
                                             CONCAT22(in_stack_fffffffffffff232,
                                                      in_stack_fffffffffffff230)));
      if (bVar2) {
        (**(code **)(*in_RDI + 0x228))(in_RDI,1);
        local_2ec = 1;
      }
      else {
        bVar2 = LPFhasKeyword((char **)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238)
                              ,(char *)CONCAT44(in_stack_fffffffffffff234,
                                                CONCAT22(in_stack_fffffffffffff232,
                                                         in_stack_fffffffffffff230)));
        if (bVar2) {
          (**(code **)(*in_RDI + 0x228))(in_RDI,0xffffffff);
          local_2ec = 1;
        }
      }
    }
    else if (local_2ec == 1) {
      bVar2 = LPFhasKeyword((char **)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
                            (char *)CONCAT44(in_stack_fffffffffffff234,
                                             CONCAT22(in_stack_fffffffffffff232,
                                                      in_stack_fffffffffffff230)));
      if (((bVar2) ||
          (bVar2 = LPFhasKeyword((char **)CONCAT44(in_stack_fffffffffffff23c,
                                                   in_stack_fffffffffffff238),
                                 (char *)CONCAT44(in_stack_fffffffffffff234,
                                                  CONCAT22(in_stack_fffffffffffff232,
                                                           in_stack_fffffffffffff230))), bVar2)) ||
         ((bVar2 = LPFhasKeyword((char **)CONCAT44(in_stack_fffffffffffff23c,
                                                   in_stack_fffffffffffff238),
                                 (char *)CONCAT44(in_stack_fffffffffffff234,
                                                  CONCAT22(in_stack_fffffffffffff232,
                                                           in_stack_fffffffffffff230))), bVar2 ||
          (bVar2 = LPFhasKeyword((char **)CONCAT44(in_stack_fffffffffffff23c,
                                                   in_stack_fffffffffffff238),
                                 (char *)CONCAT44(in_stack_fffffffffffff234,
                                                  CONCAT22(in_stack_fffffffffffff232,
                                                           in_stack_fffffffffffff230))), bVar2)))) {
        local_72c = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    ::size(local_680);
        while (local_72c = local_72c - 1, -1 < (int)local_72c) {
          pnVar8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   ::value(local_680,local_72c);
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::index(local_680,(char *)(ulong)local_72c,__c);
          local_1a0 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      ::maxObj_w((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                  *)CONCAT44(in_stack_fffffffffffff234,
                                             CONCAT22(in_stack_fffffffffffff232,
                                                      in_stack_fffffffffffff230)),
                                 in_stack_fffffffffffff22c);
          local_1a8 = pnVar8;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)CONCAT44(in_stack_fffffffffffff234,
                                  CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)),
                      (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
        }
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)0x1db670);
        local_6dc = 1;
        local_730 = 1;
        local_140 = local_6c8;
        local_148 = &local_730;
        local_70 = local_148;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
        ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     *)CONCAT44(in_stack_fffffffffffff234,
                                CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)),
                    CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
        local_2ec = 2;
      }
    }
    else if ((local_2ec == 2) &&
            (((bVar2 = LPFhasKeyword((char **)CONCAT44(in_stack_fffffffffffff23c,
                                                       in_stack_fffffffffffff238),
                                     (char *)CONCAT44(in_stack_fffffffffffff234,
                                                      CONCAT22(in_stack_fffffffffffff232,
                                                               in_stack_fffffffffffff230))), bVar2
              || (bVar2 = LPFhasKeyword((char **)CONCAT44(in_stack_fffffffffffff23c,
                                                          in_stack_fffffffffffff238),
                                        (char *)CONCAT44(in_stack_fffffffffffff234,
                                                         CONCAT22(in_stack_fffffffffffff232,
                                                                  in_stack_fffffffffffff230))),
                 bVar2)) ||
             (bVar2 = LPFhasKeyword((char **)CONCAT44(in_stack_fffffffffffff23c,
                                                      in_stack_fffffffffffff238),
                                    (char *)CONCAT44(in_stack_fffffffffffff234,
                                                     CONCAT22(in_stack_fffffffffffff232,
                                                              in_stack_fffffffffffff230))), bVar2)))
            ) {
      local_6dc = 1;
      local_734 = 1;
      local_150 = local_6c8;
      local_158 = &local_734;
      local_68 = local_158;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)CONCAT44(in_stack_fffffffffffff234,
                              CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)),
                  CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
    }
    else {
      bVar2 = LPFhasKeyword((char **)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
                            (char *)CONCAT44(in_stack_fffffffffffff234,
                                             CONCAT22(in_stack_fffffffffffff232,
                                                      in_stack_fffffffffffff230)));
      if (!bVar2) {
        bVar2 = LPFhasKeyword((char **)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238)
                              ,(char *)CONCAT44(in_stack_fffffffffffff234,
                                                CONCAT22(in_stack_fffffffffffff232,
                                                         in_stack_fffffffffffff230)));
        if (bVar2) {
          local_2ec = 3;
        }
        else {
          bVar2 = LPFhasKeyword((char **)CONCAT44(in_stack_fffffffffffff23c,
                                                  in_stack_fffffffffffff238),
                                (char *)CONCAT44(in_stack_fffffffffffff234,
                                                 CONCAT22(in_stack_fffffffffffff232,
                                                          in_stack_fffffffffffff230)));
          if (bVar2) {
            local_2ec = 5;
          }
          else {
            bVar2 = LPFhasKeyword((char **)CONCAT44(in_stack_fffffffffffff23c,
                                                    in_stack_fffffffffffff238),
                                  (char *)CONCAT44(in_stack_fffffffffffff234,
                                                   CONCAT22(in_stack_fffffffffffff232,
                                                            in_stack_fffffffffffff230)));
            if (bVar2) {
              local_2ec = 5;
            }
            else {
              bVar2 = LPFhasKeyword((char **)CONCAT44(in_stack_fffffffffffff23c,
                                                      in_stack_fffffffffffff238),
                                    (char *)CONCAT44(in_stack_fffffffffffff234,
                                                     CONCAT22(in_stack_fffffffffffff232,
                                                              in_stack_fffffffffffff230)));
              if (bVar2) {
                local_2ec = 4;
              }
              else {
                bVar2 = LPFhasKeyword((char **)CONCAT44(in_stack_fffffffffffff23c,
                                                        in_stack_fffffffffffff238),
                                      (char *)CONCAT44(in_stack_fffffffffffff234,
                                                       CONCAT22(in_stack_fffffffffffff232,
                                                                in_stack_fffffffffffff230)));
                if (bVar2) {
                  local_2ec = 4;
                }
                else {
                  bVar2 = LPFhasKeyword((char **)CONCAT44(in_stack_fffffffffffff23c,
                                                          in_stack_fffffffffffff238),
                                        (char *)CONCAT44(in_stack_fffffffffffff234,
                                                         CONCAT22(in_stack_fffffffffffff232,
                                                                  in_stack_fffffffffffff230)));
                  if (bVar2) {
                    local_6da = 1;
                    goto LAB_001ddac6;
                  }
                  bVar2 = LPFhasKeyword((char **)CONCAT44(in_stack_fffffffffffff23c,
                                                          in_stack_fffffffffffff238),
                                        (char *)CONCAT44(in_stack_fffffffffffff234,
                                                         CONCAT22(in_stack_fffffffffffff232,
                                                                  in_stack_fffffffffffff230)));
                  if (((bVar2) ||
                      (bVar2 = LPFhasKeyword((char **)CONCAT44(in_stack_fffffffffffff23c,
                                                               in_stack_fffffffffffff238),
                                             (char *)CONCAT44(in_stack_fffffffffffff234,
                                                              CONCAT22(in_stack_fffffffffffff232,
                                                                       in_stack_fffffffffffff230))),
                      bVar2)) ||
                     ((bVar2 = LPFhasKeyword((char **)CONCAT44(in_stack_fffffffffffff23c,
                                                               in_stack_fffffffffffff238),
                                             (char *)CONCAT44(in_stack_fffffffffffff234,
                                                              CONCAT22(in_stack_fffffffffffff232,
                                                                       in_stack_fffffffffffff230))),
                      bVar2 || (bVar2 = LPFhasKeyword((char **)CONCAT44(in_stack_fffffffffffff23c,
                                                                        in_stack_fffffffffffff238),
                                                      (char *)CONCAT44(in_stack_fffffffffffff234,
                                                                       CONCAT22(
                                                  in_stack_fffffffffffff232,
                                                  in_stack_fffffffffffff230))), bVar2)))) {
                    if ((local_6dc & 1) != 0) goto LAB_001ddb02;
                    local_6dc = 1;
                    local_738 = 1;
                    local_160 = local_6c8;
                    local_168 = &local_738;
                    local_60 = local_168;
                    boost::multiprecision::backends::
                    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff234,
                                            CONCAT22(in_stack_fffffffffffff232,
                                                     in_stack_fffffffffffff230)),
                                CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
                  }
                }
              }
            }
          }
        }
      }
    }
    if (local_2ec == 1) {
      LPFhasRowName((char **)in_stack_00001258,in_stack_00001250);
    }
    if ((local_2ec == 2) &&
       (bVar2 = LPFhasRowName((char **)in_stack_00001258,in_stack_00001250), bVar2)) {
      local_6d9 = 0;
    }
    while (bVar2 = LPFisSpace((int)local_718[local_6e0]), bVar2) {
      local_6e0 = local_6e0 + 1;
    }
    local_6e4 = 0;
    for (; local_718[local_6e0] != '\0'; local_6e0 = local_6e0 + 1) {
      bVar2 = LPFisSpace((int)local_718[local_6e0]);
      if ((!bVar2) ||
         (bVar2 = LPFisColName((char *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228)
                              ), bVar2)) {
        local_700[local_6e4] = local_718[local_6e0];
        local_6e4 = local_6e4 + 1;
      }
    }
    local_700[local_6e4] = '\0';
    if (*local_700 != '\0') {
      local_6e4 = 0;
      for (local_6e0 = 0; local_700[local_6e0] != '\0'; local_6e0 = local_6e0 + 1) {
        while( true ) {
          if (((local_700[local_6e0] == '+') || (bVar2 = false, local_700[local_6e0] == '-')) &&
             (bVar2 = true, local_700[local_6e0 + 1] != '+')) {
            bVar2 = local_700[local_6e0 + 1] == '-';
          }
          if (!bVar2) break;
          iVar13 = local_6e0 + 1;
          lVar12 = (long)local_6e0;
          local_6e0 = iVar13;
          if (local_700[lVar12] == '-') {
            local_b9d = '+';
            if (local_700[iVar13] != '-') {
              local_b9d = '-';
            }
            local_700[iVar13] = local_b9d;
          }
        }
        local_708[local_6e4] = local_700[local_6e0];
        local_6e4 = local_6e4 + 1;
      }
      local_708[local_6e4] = '\0';
      local_718 = local_708;
      SPxOut::debug<soplex::SPxOut,_const_char_(&)[18],_char_*&,_0>
                ((SPxOut *)in_RDI[0x3e],(char (*) [18])"DLPFRD09 pos= {}\n",&local_718);
LAB_001dbe13:
      bVar2 = false;
      if (local_718 != (char *)0x0) {
        bVar2 = *local_718 != '\0';
      }
      if (bVar2) {
        local_720 = local_718;
        switch(local_2ec) {
        case 0:
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "ELPFRD13 This seems to be no LP format file");
          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          goto LAB_001ddb02;
        case 1:
          bVar2 = LPFisValue(local_718);
          if (bVar2) {
            local_77c = 1;
            local_b0 = local_778;
            local_b8 = &local_77c;
            local_c0 = 0;
            local_c8 = 1;
            local_80 = local_b8;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor<long_long>
                      ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)CONCAT17(in_stack_fffffffffffff28f,in_stack_fffffffffffff288),
                       (longlong *)in_stack_fffffffffffff280,in_stack_fffffffffffff278);
            if ((local_6dc & 1) == 0) {
LAB_001dc0c0:
              local_6dc = 1;
              LPFreadValue(in_stack_00001318,in_stack_00001310,in_stack_0000130c);
              local_260 = local_6c8;
              local_268 = local_858;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)CONCAT44(in_stack_fffffffffffff234,
                                      CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230))
                          ,(rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
              ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)0x1dc147);
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
              ::operator*=(in_stack_fffffffffffff250,in_stack_fffffffffffff248);
              local_85c = 0;
            }
            else {
              local_2b0 = local_808;
              local_2b8 = local_6c8;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)in_stack_fffffffffffff240,
                                 (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
              spxAbs<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
                        (in_stack_fffffffffffff248);
              local_80c = 1;
              tVar3 = boost::multiprecision::operator!=
                                ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                  *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
                                 (int *)CONCAT44(in_stack_fffffffffffff234,
                                                 CONCAT22(in_stack_fffffffffffff232,
                                                          in_stack_fffffffffffff230)));
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
              ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)0x1dbfc1);
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
              ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)0x1dbfce);
              if (!tVar3) {
                local_810 = 0xffffffff;
                tVar3 = boost::multiprecision::operator==
                                  ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                    *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
                                   (int *)CONCAT44(in_stack_fffffffffffff234,
                                                   CONCAT22(in_stack_fffffffffffff232,
                                                            in_stack_fffffffffffff230)));
                if (tVar3) {
                  local_1b0 = local_778;
                  local_1b8 = local_6c8;
                  boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                               *)CONCAT44(in_stack_fffffffffffff234,
                                          CONCAT22(in_stack_fffffffffffff232,
                                                   in_stack_fffffffffffff230)),
                              (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                               *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
                }
                goto LAB_001dc0c0;
              }
              local_85c = 6;
            }
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
            ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                       *)0x1dc176);
            if (local_85c != 0) {
              if (local_85c != 6) goto LAB_001ddce7;
              goto LAB_001ddb02;
            }
          }
          if (*local_718 == '\0') goto LAB_001dbe13;
          if (((local_6dc & 1) == 0) ||
             (bVar2 = LPFisColName((char *)CONCAT44(in_stack_fffffffffffff22c,
                                                    in_stack_fffffffffffff228)), !bVar2))
          goto LAB_001ddb02;
          local_6dc = 0;
          local_6d0 = LPFreadColName(in_stack_00001260,in_stack_00001258,
                                     (LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                      *)in_stack_00001250,in_stack_00001248,in_stack_00001240);
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)in_stack_fffffffffffff240,in_stack_fffffffffffff23c,
                (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)CONCAT44(in_stack_fffffffffffff234,
                            CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)));
          break;
        case 2:
          bVar2 = LPFisValue(local_718);
          if (bVar2) {
            local_8ac = 1;
            local_90 = local_8a8;
            local_98 = &local_8ac;
            local_a0 = 0;
            local_a8 = 1;
            local_88 = local_98;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor<long_long>
                      ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)CONCAT17(in_stack_fffffffffffff28f,in_stack_fffffffffffff288),
                       (longlong *)in_stack_fffffffffffff280,in_stack_fffffffffffff278);
            if ((local_6dc & 1) == 0) {
LAB_001dc4e3:
              local_6dc = 1;
              LPFreadValue(in_stack_00001318,in_stack_00001310,in_stack_0000130c);
              local_270 = local_6c8;
              local_278 = local_988;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)CONCAT44(in_stack_fffffffffffff234,
                                      CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230))
                          ,(rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
              ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)0x1dc56a);
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
              ::operator*=(in_stack_fffffffffffff250,in_stack_fffffffffffff248);
              if (local_6d4 == 0) {
                local_85c = 0;
              }
              else {
                if (local_6d4 == 0x3c) {
                  pdVar9 = (double *)infinity();
                  local_9d0 = -*pdVar9;
                  local_118 = local_9c8;
                  local_120 = &local_9d0;
                  local_128 = 0;
                  boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                      *)0x1dc5fb);
                  local_38 = local_120;
                  lVar14 = (longdouble)*local_120;
                  in_stack_fffffffffffff228 = SUB104(lVar14,0);
                  in_stack_fffffffffffff22c = (int)((unkuint10)lVar14 >> 0x20);
                  in_stack_fffffffffffff230 = (undefined2)((unkuint10)lVar14 >> 0x40);
                  boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                  ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                               *)CONCAT44(in_stack_fffffffffffff2fc,in_stack_fffffffffffff2f8),
                              (longdouble)
                              CONCAT28(in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0));
                  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::setLhs((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)CONCAT44(in_stack_fffffffffffff234,
                                       CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)
                                      ),
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
                  boost::multiprecision::
                  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                             *)0x1dc695);
                  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::setRhs((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)CONCAT44(in_stack_fffffffffffff234,
                                       CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)
                                      ),
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
                }
                else if (local_6d4 == 0x3e) {
                  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::setLhs((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)CONCAT44(in_stack_fffffffffffff234,
                                       CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)
                                      ),
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
                  local_f8 = (double *)infinity();
                  local_f0 = local_a18;
                  local_100 = 0;
                  boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                      *)0x1dc73a);
                  local_40 = local_f8;
                  lVar14 = (longdouble)*local_f8;
                  in_stack_fffffffffffff228 = SUB104(lVar14,0);
                  in_stack_fffffffffffff22c = (int)((unkuint10)lVar14 >> 0x20);
                  in_stack_fffffffffffff230 = (undefined2)((unkuint10)lVar14 >> 0x40);
                  boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                  ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                               *)CONCAT44(in_stack_fffffffffffff2fc,in_stack_fffffffffffff2f8),
                              (longdouble)
                              CONCAT28(in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0));
                  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::setRhs((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)CONCAT44(in_stack_fffffffffffff234,
                                       CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)
                                      ),
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
                  boost::multiprecision::
                  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                             *)0x1dc7d4);
                }
                else {
                  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::setLhs((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)CONCAT44(in_stack_fffffffffffff234,
                                       CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)
                                      ),
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
                  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::setRhs((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)CONCAT44(in_stack_fffffffffffff234,
                                       CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)
                                      ),
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
                }
                LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                ::setRowVector((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)CONCAT44(in_stack_fffffffffffff234,
                                           CONCAT22(in_stack_fffffffffffff232,
                                                    in_stack_fffffffffffff230)),
                               (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
                LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                ::add((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)in_stack_fffffffffffff240,
                      (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
                SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         *)0x1dc869);
                if ((local_6d9 & 1) == 0) {
                  local_6d9 = 1;
                }
                else {
                  uVar4 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          ::num((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                 *)0x1dc89c);
                  spxSnprintf(local_a28,0x10,"C%d",(ulong)uVar4);
                  NameSet::add(in_stack_fffffffffffff240,
                               (char *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238)
                              );
                }
                local_6dc = 1;
                local_a2c = 1;
                local_170 = local_6c8;
                local_178 = &local_a2c;
                local_58 = local_178;
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)CONCAT44(in_stack_fffffffffffff234,
                                        CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230
                                                )),
                            CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
                local_6d4 = 0;
                local_718 = (char *)0x0;
                local_85c = 0x14;
              }
            }
            else {
              local_2a0 = local_938;
              local_2a8 = local_6c8;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)in_stack_fffffffffffff240,
                                 (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
              spxAbs<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
                        (in_stack_fffffffffffff248);
              local_93c = 1;
              tVar3 = boost::multiprecision::operator!=
                                ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                  *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
                                 (int *)CONCAT44(in_stack_fffffffffffff234,
                                                 CONCAT22(in_stack_fffffffffffff232,
                                                          in_stack_fffffffffffff230)));
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
              ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)0x1dc3a1);
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
              ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)0x1dc3ae);
              if (!tVar3) {
                local_940 = 0xffffffff;
                tVar3 = boost::multiprecision::operator==
                                  ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                    *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
                                   (int *)CONCAT44(in_stack_fffffffffffff234,
                                                   CONCAT22(in_stack_fffffffffffff232,
                                                            in_stack_fffffffffffff230)));
                if (tVar3) {
                  local_1c0 = local_8a8;
                  local_1c8 = local_6c8;
                  boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                               *)CONCAT44(in_stack_fffffffffffff234,
                                          CONCAT22(in_stack_fffffffffffff232,
                                                   in_stack_fffffffffffff230)),
                              (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                               *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
                }
                goto LAB_001dc4e3;
              }
              local_85c = 6;
            }
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
            ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                       *)0x1dc97d);
            if (local_85c != 0) {
              if (local_85c == 6) goto LAB_001ddb02;
              if (local_85c != 0x14) goto LAB_001ddce7;
              goto LAB_001dbe13;
            }
          }
          if (*local_718 == '\0') goto LAB_001dbe13;
          if ((local_6dc & 1) != 0) {
            bVar2 = LPFisColName((char *)CONCAT44(in_stack_fffffffffffff22c,
                                                  in_stack_fffffffffffff228));
            if (bVar2) {
              local_6d0 = LPFreadColName(in_stack_00001260,in_stack_00001258,
                                         (LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                          *)in_stack_00001250,in_stack_00001248,in_stack_00001240);
              local_a30 = 0;
              tVar3 = boost::multiprecision::operator!=
                                ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                  *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
                                 (int *)CONCAT44(in_stack_fffffffffffff234,
                                                 CONCAT22(in_stack_fffffffffffff232,
                                                          in_stack_fffffffffffff230)));
              if (tVar3) {
                local_a34 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
                                  in_stack_fffffffffffff234);
                if ((int)local_a34 < 0) {
                  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         *)in_stack_fffffffffffff240,in_stack_fffffffffffff23c,
                        (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)CONCAT44(in_stack_fffffffffffff234,
                                    CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)));
                }
                else {
                  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::value(local_680,local_a34);
                  boost::multiprecision::
                  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                  ::operator+=(in_stack_fffffffffffff250,in_stack_fffffffffffff248);
                  local_a3c[1] = 0;
                  tVar3 = boost::multiprecision::operator==
                                    ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                      *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238
                                                ),
                                     (int *)CONCAT44(in_stack_fffffffffffff234,
                                                     CONCAT22(in_stack_fffffffffffff232,
                                                              in_stack_fffffffffffff230)));
                  if (tVar3) {
                    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    ::remove(local_680,(char *)(ulong)local_a34);
                  }
                  else {
                    local_1d0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                ::value(local_680,local_a34);
                    local_1d8 = local_6c8;
                    boost::multiprecision::backends::
                    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff234,
                                            CONCAT22(in_stack_fffffffffffff232,
                                                     in_stack_fffffffffffff230)),
                                (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
                  }
                  if ((in_RDI[0x3e] != 0) &&
                     (VVar5 = SPxOut::getVerbosity((SPxOut *)in_RDI[0x3e]), 0 < (int)VVar5)) {
                    local_a3c[0] = SPxOut::getVerbosity((SPxOut *)in_RDI[0x3e]);
                    local_a40 = 1;
                    (**(code **)(*(long *)in_RDI[0x3e] + 0x10))((long *)in_RDI[0x3e],&local_a40);
                    soplex::operator<<((SPxOut *)
                                       CONCAT44(in_stack_fffffffffffff234,
                                                CONCAT22(in_stack_fffffffffffff232,
                                                         in_stack_fffffffffffff230)),
                                       (char *)CONCAT44(in_stack_fffffffffffff22c,
                                                        in_stack_fffffffffffff228));
                    NameSet::operator[]((NameSet *)
                                        CONCAT44(in_stack_fffffffffffff234,
                                                 CONCAT22(in_stack_fffffffffffff232,
                                                          in_stack_fffffffffffff230)),
                                        in_stack_fffffffffffff22c);
                    soplex::operator<<((SPxOut *)
                                       CONCAT44(in_stack_fffffffffffff234,
                                                CONCAT22(in_stack_fffffffffffff232,
                                                         in_stack_fffffffffffff230)),
                                       (char *)CONCAT44(in_stack_fffffffffffff22c,
                                                        in_stack_fffffffffffff228));
                    soplex::operator<<((SPxOut *)
                                       CONCAT44(in_stack_fffffffffffff234,
                                                CONCAT22(in_stack_fffffffffffff232,
                                                         in_stack_fffffffffffff230)),
                                       (char *)CONCAT44(in_stack_fffffffffffff22c,
                                                        in_stack_fffffffffffff228));
                    soplex::operator<<((SPxOut *)
                                       CONCAT44(in_stack_fffffffffffff234,
                                                CONCAT22(in_stack_fffffffffffff232,
                                                         in_stack_fffffffffffff230)),
                                       in_stack_fffffffffffff22c);
                    soplex::operator<<((SPxOut *)
                                       CONCAT44(in_stack_fffffffffffff234,
                                                CONCAT22(in_stack_fffffffffffff232,
                                                         in_stack_fffffffffffff230)),
                                       (_func_ostream_ptr_ostream_ptr *)
                                       CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228)
                                      );
                    (**(code **)(*(long *)in_RDI[0x3e] + 0x10))((long *)in_RDI[0x3e],local_a3c);
                  }
                }
              }
            }
            else {
              local_a44 = 1;
              tVar3 = boost::multiprecision::operator!=
                                ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                  *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
                                 (int *)CONCAT44(in_stack_fffffffffffff234,
                                                 CONCAT22(in_stack_fffffffffffff232,
                                                          in_stack_fffffffffffff230)));
              if ((tVar3) || (bVar2 = LPFisSense(local_718), !bVar2)) goto LAB_001ddb02;
            }
            local_6dc = 0;
          }
          bVar2 = LPFisSense(local_718);
          if (bVar2) {
            local_6d4 = LPFreadSense((char **)CONCAT44(in_stack_fffffffffffff234,
                                                       CONCAT22(in_stack_fffffffffffff232,
                                                                in_stack_fffffffffffff230)));
          }
          break;
        case 3:
          local_6db = 0;
          local_6d4 = 0;
          bVar2 = LPFisValue(local_718);
          if (bVar2) {
            bVar2 = LPFisInfinity((char *)CONCAT44(in_stack_fffffffffffff234,
                                                   CONCAT22(in_stack_fffffffffffff232,
                                                            in_stack_fffffffffffff230)));
            if (bVar2) {
              LPFreadInfinity((char **)in_stack_fffffffffffff2c0);
            }
            else {
              LPFreadValue(in_stack_00001318,in_stack_00001310,in_stack_0000130c);
            }
            local_280 = local_6c8;
            local_288 = local_a88;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)CONCAT44(in_stack_fffffffffffff234,
                                    CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)),
                        (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
            ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                       *)0x1dcedf);
            bVar2 = LPFisSense(local_718);
            if (!bVar2) goto LAB_001ddb02;
            local_6d4 = LPFreadSense((char **)CONCAT44(in_stack_fffffffffffff234,
                                                       CONCAT22(in_stack_fffffffffffff232,
                                                                in_stack_fffffffffffff230)));
            local_6db = 1;
          }
          bVar2 = LPFisColName((char *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228)
                              );
          if (!bVar2) goto LAB_001ddb02;
          local_6d0 = LPFreadColName(in_stack_00001260,in_stack_00001258,
                                     (LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                      *)in_stack_00001250,in_stack_00001248,in_stack_00001240);
          if (local_6d0 < 0) goto code_r0x001dcfab;
          if (local_6d4 != 0) {
            if (local_6d4 == 0x3c) {
              local_1e0 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          ::lower_w((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     *)CONCAT44(in_stack_fffffffffffff234,
                                                CONCAT22(in_stack_fffffffffffff232,
                                                         in_stack_fffffffffffff230)),
                                    in_stack_fffffffffffff22c);
              local_1e8 = local_6c8;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)CONCAT44(in_stack_fffffffffffff234,
                                      CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230))
                          ,(rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
            }
            else if (local_6d4 == 0x3e) {
              local_1f0 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          ::upper_w((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     *)CONCAT44(in_stack_fffffffffffff234,
                                                CONCAT22(in_stack_fffffffffffff232,
                                                         in_stack_fffffffffffff230)),
                                    in_stack_fffffffffffff22c);
              local_1f8 = local_6c8;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)CONCAT44(in_stack_fffffffffffff234,
                                      CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230))
                          ,(rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
            }
            else {
              local_200 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          ::lower_w((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     *)CONCAT44(in_stack_fffffffffffff234,
                                                CONCAT22(in_stack_fffffffffffff232,
                                                         in_stack_fffffffffffff230)),
                                    in_stack_fffffffffffff22c);
              local_208 = local_6c8;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)CONCAT44(in_stack_fffffffffffff234,
                                      CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230))
                          ,(rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
              local_210 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          ::upper_w((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     *)CONCAT44(in_stack_fffffffffffff234,
                                                CONCAT22(in_stack_fffffffffffff232,
                                                         in_stack_fffffffffffff230)),
                                    in_stack_fffffffffffff22c);
              local_218 = local_6c8;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)CONCAT44(in_stack_fffffffffffff234,
                                      CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230))
                          ,(rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
            }
          }
          bVar2 = LPFisFree((char *)CONCAT44(in_stack_fffffffffffff234,
                                             CONCAT22(in_stack_fffffffffffff232,
                                                      in_stack_fffffffffffff230)));
          if (bVar2) {
            pdVar9 = (double *)infinity();
            local_a98 = -*pdVar9;
            local_10 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       ::lower_w((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                  *)CONCAT44(in_stack_fffffffffffff234,
                                             CONCAT22(in_stack_fffffffffffff232,
                                                      in_stack_fffffffffffff230)),
                                 in_stack_fffffffffffff22c);
            local_18 = &local_a98;
            iVar13 = (int)((unkuint10)(longdouble)local_a98 >> 0x20);
            uVar15 = (undefined2)((unkuint10)(longdouble)local_a98 >> 0x40);
            local_8 = local_18;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
            ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)CONCAT44(in_stack_fffffffffffff2fc,in_stack_fffffffffffff2f8),
                        (longdouble)CONCAT28(in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0));
            pdVar9 = (double *)infinity();
            local_28 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       ::upper_w((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                  *)CONCAT44(in_stack_fffffffffffff234,
                                             CONCAT22(in_stack_fffffffffffff232,uVar15)),iVar13);
            lVar14 = (longdouble)*pdVar9;
            in_stack_fffffffffffff228 = SUB104(lVar14,0);
            in_stack_fffffffffffff22c = (int)((unkuint10)lVar14 >> 0x20);
            in_stack_fffffffffffff230 = (undefined2)((unkuint10)lVar14 >> 0x40);
            local_30 = pdVar9;
            local_20 = pdVar9;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
            ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)CONCAT44(in_stack_fffffffffffff2fc,in_stack_fffffffffffff2f8),
                        (longdouble)CONCAT28(in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0));
            local_6db = 1;
            local_718 = local_718 + 4;
          }
          else {
            bVar2 = LPFisSense(local_718);
            in_stack_fffffffffffff2fc = CONCAT13(bVar2,(int3)in_stack_fffffffffffff2fc);
            if (bVar2) {
              in_stack_fffffffffffff2f8 =
                   LPFreadSense((char **)CONCAT44(in_stack_fffffffffffff234,
                                                  CONCAT22(in_stack_fffffffffffff232,
                                                           in_stack_fffffffffffff230)));
              local_6db = 1;
              local_6d4 = in_stack_fffffffffffff2f8;
              bVar2 = LPFisValue(local_718);
              if (!bVar2) goto LAB_001ddb02;
              bVar2 = LPFisInfinity((char *)CONCAT44(in_stack_fffffffffffff234,
                                                     CONCAT22(in_stack_fffffffffffff232,
                                                              in_stack_fffffffffffff230)));
              if (bVar2) {
                LPFreadInfinity((char **)in_stack_fffffffffffff2c0);
              }
              else {
                LPFreadValue(in_stack_00001318,in_stack_00001310,in_stack_0000130c);
              }
              local_290 = local_6c8;
              local_298 = local_ad8;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)CONCAT44(in_stack_fffffffffffff234,
                                      CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230))
                          ,(rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
              ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)0x1dd4dd);
              if (local_6d4 == 0x3c) {
                local_220 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            ::upper_w((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                       *)CONCAT44(in_stack_fffffffffffff234,
                                                  CONCAT22(in_stack_fffffffffffff232,
                                                           in_stack_fffffffffffff230)),
                                      in_stack_fffffffffffff22c);
                in_stack_fffffffffffff2e8 = SUB82(local_220,0);
                local_228 = local_6c8;
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)CONCAT44(in_stack_fffffffffffff234,
                                        CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230
                                                )),
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
              }
              else if (local_6d4 == 0x3e) {
                in_stack_fffffffffffff2e0 =
                     LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     ::lower_w((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)CONCAT44(in_stack_fffffffffffff234,
                                           CONCAT22(in_stack_fffffffffffff232,
                                                    in_stack_fffffffffffff230)),
                               in_stack_fffffffffffff22c);
                local_238 = local_6c8;
                local_230 = in_stack_fffffffffffff2e0;
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)CONCAT44(in_stack_fffffffffffff234,
                                        CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230
                                                )),
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
              }
              else {
                local_240 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            ::lower_w((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                       *)CONCAT44(in_stack_fffffffffffff234,
                                                  CONCAT22(in_stack_fffffffffffff232,
                                                           in_stack_fffffffffffff230)),
                                      in_stack_fffffffffffff22c);
                local_248 = local_6c8;
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)CONCAT44(in_stack_fffffffffffff234,
                                        CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230
                                                )),
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
                local_250 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            ::upper_w((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                       *)CONCAT44(in_stack_fffffffffffff234,
                                                  CONCAT22(in_stack_fffffffffffff232,
                                                           in_stack_fffffffffffff230)),
                                      in_stack_fffffffffffff22c);
                local_258 = local_6c8;
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)CONCAT44(in_stack_fffffffffffff234,
                                        CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230
                                                )),
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
              }
            }
          }
          if ((local_6db & 1) != 0) break;
          goto LAB_001ddb02;
        case 4:
        case 5:
          local_6d0 = LPFreadColName(in_stack_00001260,in_stack_00001258,
                                     (LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                      *)in_stack_00001250,in_stack_00001248,in_stack_00001240);
          if (local_6d0 < 0) {
            if ((in_RDI[0x3e] != 0) &&
               (VVar5 = SPxOut::getVerbosity((SPxOut *)in_RDI[0x3e]), 0 < (int)VVar5)) {
              local_adc = SPxOut::getVerbosity((SPxOut *)in_RDI[0x3e]);
              local_ae0 = 1;
              (**(code **)(*(long *)in_RDI[0x3e] + 0x10))((long *)in_RDI[0x3e],&local_ae0);
              in_stack_fffffffffffff2c0 =
                   soplex::operator<<((SPxOut *)
                                      CONCAT44(in_stack_fffffffffffff234,
                                               CONCAT22(in_stack_fffffffffffff232,
                                                        in_stack_fffffffffffff230)),
                                      (char *)CONCAT44(in_stack_fffffffffffff22c,
                                                       in_stack_fffffffffffff228));
              soplex::operator<<((SPxOut *)
                                 CONCAT44(in_stack_fffffffffffff234,
                                          CONCAT22(in_stack_fffffffffffff232,
                                                   in_stack_fffffffffffff230)),
                                 in_stack_fffffffffffff22c);
              soplex::operator<<((SPxOut *)
                                 CONCAT44(in_stack_fffffffffffff234,
                                          CONCAT22(in_stack_fffffffffffff232,
                                                   in_stack_fffffffffffff230)),
                                 (char *)CONCAT44(in_stack_fffffffffffff22c,
                                                  in_stack_fffffffffffff228));
              soplex::operator<<((SPxOut *)
                                 CONCAT44(in_stack_fffffffffffff234,
                                          CONCAT22(in_stack_fffffffffffff232,
                                                   in_stack_fffffffffffff230)),
                                 (_func_ostream_ptr_ostream_ptr *)
                                 CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
              (**(code **)(*(long *)in_RDI[0x3e] + 0x10))((long *)in_RDI[0x3e],&local_adc);
            }
          }
          else {
            if (local_2ec == 5) {
              LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::lower((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)CONCAT44(in_stack_fffffffffffff234,
                                  CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)),
                      in_stack_fffffffffffff22c);
              local_ae4 = 0;
              tVar3 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                  *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
                                 (int *)CONCAT44(in_stack_fffffffffffff234,
                                                 CONCAT22(in_stack_fffffffffffff232,
                                                          in_stack_fffffffffffff230)));
              if (tVar3) {
                local_ae8 = 0;
                local_180 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            ::lower_w((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                       *)CONCAT44(in_stack_fffffffffffff234,
                                                  CONCAT22(in_stack_fffffffffffff232,
                                                           in_stack_fffffffffffff230)),
                                      in_stack_fffffffffffff22c);
                local_188 = &local_ae8;
                local_50 = local_188;
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)CONCAT44(in_stack_fffffffffffff234,
                                        CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230
                                                )),
                            CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
              }
              LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::upper((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)CONCAT44(in_stack_fffffffffffff234,
                                  CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)),
                      in_stack_fffffffffffff22c);
              local_aec = 1;
              in_stack_fffffffffffff28f =
                   boost::multiprecision::operator>
                             ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                               *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
                              (int *)CONCAT44(in_stack_fffffffffffff234,
                                              CONCAT22(in_stack_fffffffffffff232,
                                                       in_stack_fffffffffffff230)));
              if ((bool)in_stack_fffffffffffff28f) {
                local_af0 = 1;
                in_stack_fffffffffffff280 =
                     (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        ::upper_w((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   *)CONCAT44(in_stack_fffffffffffff234,
                                              CONCAT22(in_stack_fffffffffffff232,
                                                       in_stack_fffffffffffff230)),
                                  in_stack_fffffffffffff22c);
                local_198 = &local_af0;
                local_190 = in_stack_fffffffffffff280;
                local_48 = local_198;
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)CONCAT44(in_stack_fffffffffffff234,
                                        CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230
                                                )),
                            CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
              }
            }
            if (local_2e8 != 0) {
              DIdxSet::addIdx((DIdxSet *)
                              CONCAT44(in_stack_fffffffffffff234,
                                       CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)
                                      ),in_stack_fffffffffffff22c);
            }
          }
          break;
        default:
          local_b12 = 1;
          uVar10 = __cxa_allocate_exception(0x28);
          paVar16 = &local_b11;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_b10,"XLPFRD01 This should never happen.",paVar16);
          SPxInternalCodeException::SPxInternalCodeException
                    ((SPxInternalCodeException *)
                     CONCAT44(in_stack_fffffffffffff234,
                              CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)),
                     (string *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
          local_b12 = 0;
          __cxa_throw(uVar10,&SPxInternalCodeException::typeinfo,
                      SPxInternalCodeException::~SPxInternalCodeException);
        }
        if (local_718 == local_720) goto LAB_001ddb02;
        goto LAB_001dbe13;
      }
    }
  } while( true );
code_r0x001dcfab:
  if ((in_RDI[0x3e] != 0) && (VVar5 = SPxOut::getVerbosity((SPxOut *)in_RDI[0x3e]), 0 < (int)VVar5))
  {
    local_a8c = SPxOut::getVerbosity((SPxOut *)in_RDI[0x3e]);
    local_a90 = 1;
    (**(code **)(*(long *)in_RDI[0x3e] + 0x10))((long *)in_RDI[0x3e],&local_a90);
    soplex::operator<<((SPxOut *)
                       CONCAT44(in_stack_fffffffffffff234,
                                CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)),
                       (char *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
    soplex::operator<<((SPxOut *)
                       CONCAT44(in_stack_fffffffffffff234,
                                CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)),
                       in_stack_fffffffffffff22c);
    soplex::operator<<((SPxOut *)
                       CONCAT44(in_stack_fffffffffffff234,
                                CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)),
                       (char *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
    soplex::operator<<((SPxOut *)
                       CONCAT44(in_stack_fffffffffffff234,
                                CONCAT22(in_stack_fffffffffffff232,in_stack_fffffffffffff230)),
                       (_func_ostream_ptr_ostream_ptr *)
                       CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
    (**(code **)(*(long *)in_RDI[0x3e] + 0x10))((long *)in_RDI[0x3e],&local_a8c);
  }
  *local_718 = '\0';
  goto LAB_001dbe13;
}

Assistant:

inline
bool SPxLPBase<Rational>::readLPF(
   std::istream& p_input,                ///< input stream.
   NameSet*      p_rnames,               ///< row names.
   NameSet*      p_cnames,               ///< column names.
   DIdxSet*      p_intvars)              ///< integer variables.
{
   enum
   {
      START, OBJECTIVE, CONSTRAINTS, BOUNDS, INTEGERS, BINARIES
   } section = START;

   NameSet* rnames;                      ///< row names.
   NameSet* cnames;                      ///< column names.

   LPColSetBase<Rational> cset;              ///< the set of columns read.
   LPRowSetBase<Rational> rset;              ///< the set of rows read.
   LPColBase<Rational> emptycol;             ///< reusable empty column.
   LPRowBase<Rational> row;                  ///< last assembled row.
   DSVectorBase<Rational> vec;               ///< last assembled vector (from row).

   Rational val = 1;
   int colidx;
   int sense = 0;

   int lineno = 0;
   bool unnamed = true;
   bool finished = false;
   bool other;
   bool have_value = true;
   int i;
   int k;
   int buf_size;
   int buf_pos;
   char* buf = nullptr;
   char* tmp = nullptr;
   char* line = nullptr;
   char* s = nullptr;
   char* pos = nullptr;
   char* pos_old = nullptr;

   if(p_cnames)
      cnames = p_cnames;
   else
   {
      cnames = nullptr;
      spx_alloc(cnames);
      cnames = new(cnames) NameSet();
   }

   cnames->clear();

   if(p_rnames)
      rnames = p_rnames;
   else
   {
      try
      {
         rnames = nullptr;
         spx_alloc(rnames);
         rnames = new(rnames) NameSet();
      }
      catch(const SPxMemoryException& x)
      {
         if(!p_cnames)
         {
            cnames->~NameSet();
            spx_free(cnames);
         }

         throw x;
      }
   }

   rnames->clear();

   SPxLPBase<Rational>::clear(); // clear the LP.

   //--------------------------------------------------------------------------
   //--- Main Loop
   //--------------------------------------------------------------------------
   buf_size = SOPLEX_LPF_MAX_LINE_LEN;
   spx_alloc(buf, buf_size);
   spx_alloc(tmp, buf_size);
   spx_alloc(line, buf_size);

   for(;;)
   {
      buf_pos = 0;

      while(!p_input.getline(buf + buf_pos, buf_size - buf_pos))
      {
         p_input.clear();

         if(strlen(buf) == (size_t) buf_size - 1)
         {
            buf_pos = buf_size - 1;
            buf_size = buf_size + SOPLEX_LPF_MAX_LINE_LEN;

            if(buf_size >= INT_MAX)
            {
               SPX_MSG_ERROR(std::cerr << "ELPFRD16 Line longer than INT_MAX" << std::endl;)
               goto syntax_error;
            }

            spx_realloc(buf, buf_size);
         }
         else
         {
            SPX_MSG_ERROR(std::cerr << "ELPFRD07 No 'End' marker found" << std::endl;)
            finished = true;
            break;
         }
      }

      if(finished)
         break;

      if((size_t) buf_size > sizeof(tmp))
      {
         spx_realloc(tmp, buf_size);
         spx_realloc(line, buf_size);
      }

      lineno++;
      i   = 0;
      pos = buf;

      SPxOut::debug(spxout, "DLPFRD08 Reading line {} (pos={})\n", lineno, pos);

      // 1. Remove comments.
      if(nullptr != (s = strchr(buf, '\\')))
         * s = '\0';

      // 2. Look for keywords.
      if(section == START)
      {
         if(LPFhasKeyword(pos, "max[imize]"))
         {
            changeSense(SPxLPBase<Rational>::MAXIMIZE);
            section = OBJECTIVE;
         }
         else if(LPFhasKeyword(pos, "min[imize]"))
         {
            changeSense(SPxLPBase<Rational>::MINIMIZE);
            section = OBJECTIVE;
         }
      }
      else if(section == OBJECTIVE)
      {
         if(LPFhasKeyword(pos, "s[ubject][   ]t[o]")
               || LPFhasKeyword(pos, "s[uch][    ]t[hat]")
               || LPFhasKeyword(pos, "s[.][    ]t[.]")
               || LPFhasKeyword(pos, "lazy con[straints]"))
         {
            // store objective vector
            for(int j = vec.size() - 1; j >= 0; --j)
               cset.maxObj_w(vec.index(j)) = vec.value(j);

            // multiplication with -1 for minimization is done below
            vec.clear();
            have_value = true;
            val = 1;
            section = CONSTRAINTS;
         }
      }
      else if(section == CONSTRAINTS &&
              (LPFhasKeyword(pos, "s[ubject][   ]t[o]")
               || LPFhasKeyword(pos, "s[uch][    ]t[hat]")
               || LPFhasKeyword(pos, "s[.][    ]t[.]")))
      {
         have_value = true;
         val = 1;
      }
      else
      {
         if(LPFhasKeyword(pos, "lazy con[straints]"))
            ;
         else if(LPFhasKeyword(pos, "bound[s]"))
            section = BOUNDS;
         else if(LPFhasKeyword(pos, "bin[ary]"))
            section = BINARIES;
         else if(LPFhasKeyword(pos, "bin[aries]"))
            section = BINARIES;
         else if(LPFhasKeyword(pos, "gen[erals]"))
            section = INTEGERS;
         else if(LPFhasKeyword(pos, "int[egers]"))   // this is undocumented
            section = INTEGERS;
         else if(LPFhasKeyword(pos, "end"))
         {
            finished = true;
            break;
         }
         else if(LPFhasKeyword(pos, "s[ubject][   ]t[o]")  // second time
                 || LPFhasKeyword(pos, "s[uch][    ]t[hat]")
                 || LPFhasKeyword(pos, "s[.][    ]t[.]")
                 || LPFhasKeyword(pos, "lazy con[straints]"))
         {
            // In principle this has to checked for all keywords above,
            // otherwise we just ignore any half finished constraint
            if(have_value)
               goto syntax_error;

            have_value = true;
            val = 1;
         }
      }

      // 3a. Look for row names in objective and drop it.
      if(section == OBJECTIVE)
         LPFhasRowName(pos, nullptr);

      // 3b. Look for row name in constraint and store it.
      if(section == CONSTRAINTS)
         if(LPFhasRowName(pos, rnames))
            unnamed = false;

      // 4a. Remove initial spaces.
      while(LPFisSpace(pos[i]))
         i++;

      // 4b. remove spaces if they do not appear before the name of a vaiable.
      for(k = 0; pos[i] != '\0'; i++)
         if(!LPFisSpace(pos[i]) || LPFisColName(&pos[i + 1]))
            tmp[k++] = pos[i];

      tmp[k] = '\0';

      // 5. Is this an empty line ?
      if(tmp[0] == '\0')
         continue;

      // 6. Collapse sequences of '+' and '-'. e.g ++---+ => -
      for(i = 0, k = 0; tmp[i] != '\0'; i++)
      {
         while(((tmp[i] == '+') || (tmp[i] == '-')) && ((tmp[i + 1] == '+') || (tmp[i + 1] == '-')))
         {
            if(tmp[i++] == '-')
               tmp[i] = (tmp[i] == '-') ? '+' : '-';
         }

         line[k++] = tmp[i];
      }

      line[k] = '\0';

      //-----------------------------------------------------------------------
      //--- Line processing loop
      //-----------------------------------------------------------------------
      pos = line;

      SPxOut::debug(spxout, "DLPFRD09 pos= {}\n", pos);

      // 7. We have something left to process.
      while((pos != nullptr) && (*pos != '\0'))
      {
         // remember our position, so we are sure we make progress.
         pos_old = pos;

         // now process the sections
         switch(section)
         {
         case OBJECTIVE:
            if(LPFisValue(pos))
            {
               Rational pre_sign = 1;

               /* Already having here a value could only result from being the first number in a constraint, or a sign
                * '+' or '-' as last token on the previous line.
                */
               if(have_value)
               {
                  if(spxAbs(val) != 1)
                     goto syntax_error;

                  if(val == -1)
                     pre_sign = val;
               }

               have_value = true;
               val = LPFreadValue(pos, spxout, lineno);
               val *= pre_sign;
            }

            if(*pos == '\0')
               continue;

            if(!have_value || !LPFisColName(pos))
               goto syntax_error;

            have_value = false;
            colidx = LPFreadColName(pos, cnames, cset, &emptycol, spxout);
            vec.add(colidx, val);
            break;

         case CONSTRAINTS:
            if(LPFisValue(pos))
            {
               Rational pre_sign = 1;

               /* Already having here a value could only result from being the first number in a constraint, or a sign
                * '+' or '-' as last token on the previous line.
                */
               if(have_value)
               {
                  if(spxAbs(val) != 1)
                     goto syntax_error;

                  if(val == -1)
                     pre_sign = val;
               }

               have_value = true;
               val = LPFreadValue(pos, spxout, lineno);
               val *= pre_sign;

               if(sense != 0)
               {
                  if(sense == '<')
                  {
                     row.setLhs(-infinity);
                     row.setRhs(val);
                  }
                  else if(sense == '>')
                  {
                     row.setLhs(val);
                     row.setRhs(infinity);
                  }
                  else
                  {
                     assert(sense == '=');

                     row.setLhs(val);
                     row.setRhs(val);
                  }

                  row.setRowVector(vec);
                  rset.add(row);
                  vec.clear();

                  if(!unnamed)
                     unnamed = true;
                  else
                  {
                     char name[16];
                     spxSnprintf(name, 16, "C%d", rset.num());
                     rnames->add(name);
                  }

                  have_value = true;
                  val = 1;
                  sense = 0;
                  pos = nullptr;
                  // next line
                  continue;
               }
            }

            if(*pos == '\0')
               continue;

            if(have_value)
            {
               if(LPFisColName(pos))
               {
                  colidx = LPFreadColName(pos, cnames, cset, &emptycol, spxout);

                  if(val != 0)
                  {
                     // Do we have this index already in the row?
                     int n = vec.pos(colidx);

                     // if not, add it
                     if(n < 0)
                        vec.add(colidx, val);
                     // if yes, add them up and remove the element if it amounts to zero
                     else
                     {
                        assert(vec.index(n) == colidx);

                        val += vec.value(n);

                        if(val == 0)
                           vec.remove(n);
                        else
                           vec.value(n) = val;

                        assert(cnames->has(colidx));

                        SPX_MSG_WARNING((*this->spxout), (*this->spxout) << "WLPFRD10 Duplicate index "
                                        << (*cnames)[colidx]
                                        << " in line " << lineno
                                        << std::endl;)
                     }
                  }

                  have_value = false;
               }
               else
               {
                  // We have a row like c1: <= 5 with no variables. We can not handle 10 <= 5; issue a syntax error.
                  if(val != 1)
                     goto syntax_error;

                  // If the next thing is not the sense we give up also.
                  if(!LPFisSense(pos))
                     goto syntax_error;

                  have_value = false;
               }
            }

            assert(!have_value);

            if(LPFisSense(pos))
               sense = LPFreadSense(pos);

            break;

         case BOUNDS:
            other = false;
            sense = 0;

            if(LPFisValue(pos))
            {
               val = LPFisInfinity(pos) ? LPFreadInfinity(pos) : LPFreadValue(pos, spxout, lineno);

               if(!LPFisSense(pos))
                  goto syntax_error;

               sense = LPFreadSense(pos);
               other = true;
            }

            if(!LPFisColName(pos))
               goto syntax_error;

            if((colidx = LPFreadColName(pos, cnames, cset, nullptr, spxout)) < 0)
            {
               SPX_MSG_WARNING((*this->spxout), (*this->spxout) << "WLPFRD11 in Bounds section line "
                               << lineno << " ignored" << std::endl;)
               *pos = '\0';
               continue;
            }

            if(sense)
            {
               if(sense == '<')
                  cset.lower_w(colidx) = val;
               else if(sense == '>')
                  cset.upper_w(colidx) = val;
               else
               {
                  assert(sense == '=');
                  cset.lower_w(colidx) = val;
                  cset.upper_w(colidx) = val;
               }
            }

            if(LPFisFree(pos))
            {
               cset.lower_w(colidx) = -infinity;
               cset.upper_w(colidx) =  infinity;
               other = true;
               pos += 4;  // set position after the word "free"
            }
            else if(LPFisSense(pos))
            {
               sense = LPFreadSense(pos);
               other = true;

               if(!LPFisValue(pos))
                  goto syntax_error;

               val = LPFisInfinity(pos) ? LPFreadInfinity(pos) : LPFreadValue(pos,  spxout, lineno);

               if(sense == '<')
                  cset.upper_w(colidx) = val;
               else if(sense == '>')
                  cset.lower_w(colidx) = val;
               else
               {
                  assert(sense == '=');
                  cset.lower_w(colidx) = val;
                  cset.upper_w(colidx) = val;
               }
            }

            /* Do we have only a single column name in the input line?  We could ignore this savely, but it is probably
             * a sign of some other error.
             */
            if(!other)
               goto syntax_error;

            break;

         case BINARIES:
         case INTEGERS:
            if((colidx = LPFreadColName(pos, cnames, cset, nullptr, spxout)) < 0)
            {
               SPX_MSG_WARNING((*this->spxout),
                               (*this->spxout) << "WLPFRD12 in Binary/General section line " << lineno
                               << " ignored" << std::endl;)
            }
            else
            {
               if(section == BINARIES)
               {
                  if(cset.lower(colidx) < 0)
                  {
                     cset.lower_w(colidx) = 0;
                  }

                  if(cset.upper(colidx) > 1)
                  {
                     cset.upper_w(colidx) = 1;
                  }
               }

               if(p_intvars != nullptr)
                  p_intvars->addIdx(colidx);
            }

            break;

         case START:
            SPX_MSG_ERROR(std::cerr << "ELPFRD13 This seems to be no LP format file" << std::endl;)
            goto syntax_error;

         default:
            throw SPxInternalCodeException("XLPFRD01 This should never happen.");
         }

         if(pos == pos_old)
            goto syntax_error;
      }
   }

   assert(isConsistent());

   addCols(cset);
   assert(isConsistent());

   addRows(rset);
   assert(isConsistent());

syntax_error:

   if(finished)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Finished reading " << lineno << " lines" <<
                    std::endl;)
   }
   else
      SPX_MSG_ERROR(std::cerr << "ELPFRD15 Syntax error in line " << lineno << std::endl;)

      if(p_cnames == nullptr)
         spx_free(cnames);

   if(p_rnames == nullptr)
      spx_free(rnames);

   spx_free(buf);
   spx_free(tmp);
   spx_free(line);

   return finished;
}